

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O1

int __thiscall CSnapshotBuilder::Finish(CSnapshotBuilder *this,void *pSnapdata)

{
  int iVar1;
  uint size;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long in_FS_OFFSET;
  int aItemSizes [1024];
  
  aItemSizes[2] = 0;
  aItemSizes[3] = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->m_NumItems;
  lVar6 = (long)iVar1;
  *(int *)pSnapdata = this->m_DataSize;
  *(int *)((long)pSnapdata + 4) = iVar1;
  if (0 < lVar6) {
    lVar3 = 0;
    do {
      *(undefined4 *)((long)pSnapdata + lVar3 * 4 + 8) =
           *(undefined4 *)(this->m_aData + this->m_aOffsets[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar6 != lVar3);
  }
  if (0 < iVar1) {
    iVar7 = this->m_DataSize;
    lVar3 = 0;
    do {
      iVar5 = iVar7;
      if (lVar3 < lVar6 + -1) {
        iVar5 = this->m_aOffsets[lVar3 + 1];
      }
      aItemSizes[lVar3] = iVar5 - this->m_aOffsets[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar6 != lVar3);
  }
  if (1 < iVar1) {
    do {
      lVar3 = 0;
      bVar4 = false;
      do {
        iVar7 = *(int *)((long)pSnapdata + lVar3 * 4 + 8);
        iVar5 = *(int *)((long)pSnapdata + lVar3 * 4 + 0xc);
        if (iVar5 < iVar7) {
          *(int *)((long)pSnapdata + lVar3 * 4 + 0xc) = iVar7;
          *(int *)((long)pSnapdata + lVar3 * 4 + 8) = iVar5;
          *(ulong *)(this->m_aOffsets + lVar3) =
               CONCAT44((int)*(undefined8 *)(this->m_aOffsets + lVar3),
                        (int)((ulong)*(undefined8 *)(this->m_aOffsets + lVar3) >> 0x20));
          *(ulong *)(aItemSizes + lVar3) =
               CONCAT44((int)*(undefined8 *)(aItemSizes + lVar3),
                        (int)((ulong)*(undefined8 *)(aItemSizes + lVar3) >> 0x20));
          bVar4 = true;
        }
        lVar3 = lVar3 + 1;
      } while (lVar6 + -1 != lVar3);
    } while ((1 < iVar1) && (bVar4));
  }
  if (0 < iVar1) {
    lVar3 = 0;
    iVar7 = 0;
    do {
      *(int *)((long)pSnapdata + lVar3 * 4 + (long)*(int *)((long)pSnapdata + 4) * 4 + 8) = iVar7;
      size = aItemSizes[lVar3];
      mem_copy((void *)((long)pSnapdata + (long)iVar7 + (long)*(int *)((long)pSnapdata + 4) * 8 + 8)
               ,this->m_aData + this->m_aOffsets[lVar3],size);
      iVar7 = iVar7 + size;
      lVar3 = lVar3 + 1;
    } while (lVar6 != lVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return this->m_DataSize + iVar1 * 8 + 8;
  }
  __stack_chk_fail();
}

Assistant:

int CSnapshotBuilder::Finish(void *pSnapdata)
{
	// flattern and make the snapshot
	CSnapshot *pSnap = (CSnapshot *)pSnapdata;
	int OffsetSize = sizeof(int)*m_NumItems;
	int KeySize = sizeof(int)*m_NumItems;
	pSnap->m_DataSize = m_DataSize;
	pSnap->m_NumItems = m_NumItems;

	const int NumItems = m_NumItems;
	for(int i = 0; i < NumItems; i++)
	{
		pSnap->SortedKeys()[i] = GetItem(i)->Key();
	}

	// get full item sizes
	int aItemSizes[CSnapshotBuilder::MAX_ITEMS];

	for(int i = 0; i < NumItems; i++)
	{
		if(i < NumItems - 1)
		{
			aItemSizes[i] = m_aOffsets[i+1] - m_aOffsets[i];
		}
		else
		{
			aItemSizes[i] = m_DataSize - m_aOffsets[i];
		}
	}

	// bubble sort by keys
	bool Sorting = true;
	while(Sorting)
	{
		Sorting = false;

		for(int i = 1; i < NumItems; i++)
		{
			if(pSnap->SortedKeys()[i-1] > pSnap->SortedKeys()[i])
			{
				Sorting = true;
				std::swap(pSnap->SortedKeys()[i], pSnap->SortedKeys()[i-1]);
				std::swap(m_aOffsets[i], m_aOffsets[i-1]);
				std::swap(aItemSizes[i], aItemSizes[i-1]);
			}
		}
	}

	// copy sorted items
	int OffsetCur = 0;
	for(int i = 0; i < NumItems; i++)
	{
		pSnap->Offsets()[i] = OffsetCur;
		mem_copy(pSnap->DataStart()+OffsetCur, m_aData + m_aOffsets[i], aItemSizes[i]);
		OffsetCur += aItemSizes[i];
	}

	return sizeof(CSnapshot) + KeySize + OffsetSize + m_DataSize;
}